

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Skeleton_blocker_complex.h
# Opt level: O3

bool __thiscall
Gudhi::skeleton_blocker::
Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::contains_vertices
          (Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits> *this,
          Simplex *sigma)

{
  Vertex_handle address;
  Graph_vertex *pGVar1;
  _Rb_tree_node_base *p_Var2;
  
  p_Var2 = (sigma->simplex_set)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    if ((_Rb_tree_header *)p_Var2 == &(sigma->simplex_set)._M_t._M_impl.super__Rb_tree_header) {
      return true;
    }
    address.vertex = p_Var2[1]._M_color;
    if (address.vertex < 0) {
      return false;
    }
    if ((int)((ulong)((long)(this->skeleton).super_type.m_vertices.
                            super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>,_boost::vecS,_boost::setS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>,_boost::vecS,_boost::setS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->skeleton).super_type.m_vertices.
                           super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>,_boost::vecS,_boost::setS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>,_boost::vecS,_boost::setS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 6) <= address.vertex) {
      return false;
    }
    pGVar1 = operator[](this,address);
    if (pGVar1->is_active_ != true) break;
    p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
  }
  return false;
}

Assistant:

bool contains_vertices(const Simplex & sigma) const {
    for (auto vertex : sigma)
      if (!contains_vertex(vertex))
        return false;
    return true;
  }